

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElemStack.cpp
# Opt level: O1

XMLSize_t __thiscall xercesc_4_0::WFElemStack::addLevel(WFElemStack *this)

{
  XMLSize_t XVar1;
  StackElem **ppSVar2;
  StackElem *pSVar3;
  
  if (this->fStackTop == this->fStackCapacity) {
    expandStack(this);
  }
  if (this->fStack[this->fStackTop] == (StackElem *)0x0) {
    pSVar3 = (StackElem *)XMemory::operator_new(0x18,this->fMemoryManager);
    XVar1 = this->fStackTop;
    this->fStack[XVar1] = pSVar3;
    ppSVar2 = this->fStack;
    ppSVar2[XVar1]->fThisElement = (XMLCh *)0x0;
    ppSVar2[XVar1]->fElemMaxLength = 0;
  }
  XVar1 = this->fStackTop;
  ppSVar2 = this->fStack;
  pSVar3 = ppSVar2[XVar1];
  pSVar3->fReaderNum = 0xffffffff;
  pSVar3->fCurrentURI = this->fUnknownNamespaceId;
  pSVar3->fTopPrefix = -1;
  if (XVar1 != 0) {
    pSVar3->fTopPrefix = ppSVar2[XVar1 - 1]->fTopPrefix;
  }
  this->fStackTop = XVar1 + 1;
  return XVar1;
}

Assistant:

XMLSize_t WFElemStack::addLevel()
{
    // See if we need to expand the stack
    if (fStackTop == fStackCapacity)
        expandStack();

    
    // If this element has not been initialized yet, then initialize it
    if (!fStack[fStackTop])
    {
        fStack[fStackTop] = new (fMemoryManager) StackElem;
        fStack[fStackTop]->fThisElement = 0;
        fStack[fStackTop]->fElemMaxLength = 0;
    }

    // Set up the new top row
    fStack[fStackTop]->fReaderNum = 0xFFFFFFFF;
    fStack[fStackTop]->fCurrentURI = fUnknownNamespaceId;
    fStack[fStackTop]->fTopPrefix = -1;

    if (fStackTop != 0)
        fStack[fStackTop]->fTopPrefix = fStack[fStackTop - 1]->fTopPrefix;

    // Bump the top of stack
    fStackTop++;

    return fStackTop-1;
}